

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

ssize_t __thiscall Kvm::read(Kvm *this,int __fd,void *__buf,size_t __nbytes)

{
  GcGuard *this_00;
  bool bVar1;
  char c_00;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  Value *pVVar5;
  KatException *pKVar6;
  long *plVar7;
  istream *piVar8;
  ostream *poVar9;
  void *__buf_00;
  undefined4 in_register_00000034;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  string msg;
  GcGuard guard;
  Value *result;
  undefined1 local_100 [8];
  string symbol;
  string local_d8;
  undefined1 local_b8 [8];
  string buffer;
  string local_90;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  char local_31;
  long lStack_30;
  char c;
  long num;
  istream *piStack_20;
  int sign;
  istream *in_local;
  Kvm *this_local;
  
  piStack_20 = (istream *)CONCAT44(in_register_00000034,__fd);
  in_local = (istream *)this;
  anon_unknown.dwarf_ebf5::eatWhitespace(piStack_20);
  num._4_4_ = 1;
  lStack_30 = 0;
  std::operator>>(piStack_20,&local_31);
  uVar4 = std::ios::operator!((ios *)(piStack_20 + *(long *)(*(long *)piStack_20 + -0x18)));
  if ((uVar4 & 1) != 0) {
    return 0;
  }
  if (local_31 == '#') {
    std::operator>>(piStack_20,&local_31);
    if (local_31 == 't') {
      return (ssize_t)this->TRUE;
    }
    if (local_31 == 'f') {
      return (ssize_t)this->FALSE;
    }
    if (local_31 == '\\') {
      pVVar5 = readCharacter(this,piStack_20);
      return (ssize_t)pVVar5;
    }
    local_6d = 1;
    pKVar6 = (KatException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"unknown boolean literal",&local_59);
    anon_unknown.dwarf_ebf5::KatException::KatException(pKVar6,&local_58);
    local_6d = 0;
    __cxa_throw(pKVar6,&(anonymous_namespace)::KatException::typeinfo,
                anon_unknown.dwarf_ebf5::KatException::~KatException);
  }
  iVar3 = isdigit((int)local_31);
  if (iVar3 != 0) {
    plVar7 = (long *)std::istream::putback((char)piStack_20);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
    if (bVar1) goto LAB_00119fbf;
  }
  if (local_31 == '-') {
    iVar3 = std::istream::peek();
    iVar3 = isdigit(iVar3);
    if (iVar3 != 0) {
      num._4_4_ = -1;
LAB_00119fbf:
      while( true ) {
        piVar8 = std::operator>>(piStack_20,&local_31);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
        bVar1 = false;
        if (bVar2) {
          iVar3 = isdigit((int)local_31);
          bVar1 = iVar3 != 0;
        }
        if (!bVar1) break;
        lStack_30 = lStack_30 * 10 + (long)(local_31 + -0x30);
      }
      lStack_30 = num._4_4_ * lStack_30;
      bVar1 = anon_unknown.dwarf_ebf5::isDelimiter(local_31);
      if (bVar1) {
        std::istream::putback((char)piStack_20);
        pVVar5 = makeFixnum(this,lStack_30);
        return (ssize_t)pVVar5;
      }
      buffer.field_2._M_local_buf[0xe] = '\x01';
      pKVar6 = (KatException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"number not followed by delimiter",
                 (allocator<char> *)(buffer.field_2._M_local_buf + 0xf));
      anon_unknown.dwarf_ebf5::KatException::KatException(pKVar6,&local_90);
      buffer.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pKVar6,&(anonymous_namespace)::KatException::typeinfo,
                  anon_unknown.dwarf_ebf5::KatException::~KatException);
    }
  }
  if (local_31 == '\"') {
    std::__cxx11::string::string((string *)local_b8);
    do {
      piVar8 = std::operator>>(piStack_20,&local_31);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
      if (!bVar1 || local_31 == '\"') {
        this_local = (Kvm *)makeString(this,(string *)local_b8);
        std::__cxx11::string::~string((string *)local_b8);
        return (ssize_t)this_local;
      }
      if (local_31 == '\\') {
        piVar8 = std::operator>>(piStack_20,&local_31);
        bVar1 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
        if (!bVar1) {
          symbol.field_2._M_local_buf[0xe] = '\x01';
          pKVar6 = (KatException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"non-terminated string literal",
                     (allocator<char> *)(symbol.field_2._M_local_buf + 0xf));
          anon_unknown.dwarf_ebf5::KatException::KatException(pKVar6,&local_d8);
          symbol.field_2._M_local_buf[0xe] = '\0';
          __cxa_throw(pKVar6,&(anonymous_namespace)::KatException::typeinfo,
                      anon_unknown.dwarf_ebf5::KatException::~KatException);
        }
        if (local_31 == 'n') {
          local_31 = '\n';
        }
      }
      std::__cxx11::string::append((ulong)local_b8,'\x01');
    } while( true );
  }
  bVar1 = anon_unknown.dwarf_ebf5::isInitial(local_31);
  if (bVar1) {
LAB_0011a39b:
    std::__cxx11::string::string((string *)local_100);
    while( true ) {
      bVar2 = anon_unknown.dwarf_ebf5::isInitial(local_31);
      bVar1 = true;
      if (!bVar2) {
        iVar3 = isdigit((int)local_31);
        bVar1 = true;
        if ((iVar3 == 0) && (bVar1 = true, local_31 != '+')) {
          bVar1 = local_31 == '-';
        }
      }
      if (!bVar1) break;
      std::__cxx11::string::append((ulong)local_100,'\x01');
      std::operator>>(piStack_20,&local_31);
    }
    bVar1 = anon_unknown.dwarf_ebf5::isDelimiter(local_31);
    if (bVar1) {
      std::istream::putback((char)piStack_20);
      this_local = (Kvm *)makeSymbol(this,(string *)local_100);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,"symbol not followed by delimiter. ");
      poVar9 = std::operator<<(poVar9,"Found \'");
      poVar9 = std::operator<<(poVar9,local_31);
      poVar9 = std::operator<<(poVar9,"\'");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)local_100);
    if (!bVar1) {
      pKVar6 = (KatException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"illegal read state",&local_161);
      anon_unknown.dwarf_ebf5::KatException::KatException(pKVar6,&local_160);
      __cxa_throw(pKVar6,&(anonymous_namespace)::KatException::typeinfo,
                  anon_unknown.dwarf_ebf5::KatException::~KatException);
    }
  }
  else {
    if ((local_31 == '+') || (local_31 == '-')) {
      c_00 = std::istream::peek();
      bVar1 = anon_unknown.dwarf_ebf5::isDelimiter(c_00);
      if (bVar1) goto LAB_0011a39b;
    }
    if (local_31 == '(') {
      this_local = (Kvm *)readPair(this,piStack_20);
    }
    else {
      if (local_31 != '\'') {
        std::__cxx11::string::string((string *)local_140);
        std::__cxx11::string::append((char *)local_140);
        std::__cxx11::string::append((ulong)local_140,'\x01');
        std::__cxx11::string::append(local_140);
        pKVar6 = (KatException *)__cxa_allocate_exception(0x10);
        anon_unknown.dwarf_ebf5::KatException::KatException(pKVar6,(string *)local_140);
        __cxa_throw(pKVar6,&(anonymous_namespace)::KatException::typeinfo,
                    anon_unknown.dwarf_ebf5::KatException::~KatException);
      }
      guard.times_ = 0;
      this_00 = (GcGuard *)((long)&msg.field_2 + 8);
      GcGuard::GcGuard(this_00,&this->gc_);
      GcGuard::pushLocalStackRoot(this_00,(Value **)&guard.times_);
      guard.times_ = read(this,(int)piStack_20,__buf_00,__nbytes);
      if ((Value *)guard.times_ == (Value *)0x0) {
        this_local = (Kvm *)0x0;
      }
      else {
        guard.times_ = (long)makeCell(this,(Value *)guard.times_,this->NIL);
        this_local = (Kvm *)makeCell(this,this->QUOTE,(Value *)guard.times_);
      }
      guard.times_ = (long)this_local;
      GcGuard::~GcGuard((GcGuard *)((long)&msg.field_2 + 8));
    }
  }
  return (ssize_t)this_local;
}

Assistant:

const Value* Kvm::read(std::istream &in)
{
    eatWhitespace(in);

    int sign{1};
    long num{0};
    char c;
    in >> c;

    if (!in)
    {
        return nullptr;
    }
    if (c == '#') /* read a boolean */
    {
        in >> c;
        if (c == 't')
            return TRUE;
        else if (c == 'f')
            return FALSE;
        else if (c == '\\')
            return readCharacter(in);
        else
        {
            throw KatException("unknown boolean literal");
        }
    } else if ((isdigit(c) && in.putback(c)) ||
               (c == '-' && isdigit(in.peek()) && (sign = -1)))
    {
        /* read a fixnum */
        while (in >> c && isdigit(c))
        {
            num = num * 10 + (c - '0');
        }
        num *= sign;
        if (isDelimiter(c))
        {
            in.putback(c);
            return makeFixnum(num);
        } else
        {
            throw KatException("number not followed by delimiter");
        }
    } else if (c == '"')
    {
        string buffer;
        while (in >> c && c != '"')
        {
            if (c == '\\')
            {
                if (in >> c)
                {
                    if (c == 'n') c = '\n';
                } else
                {
                    throw KatException("non-terminated string literal");
                }
            }
            buffer.append(1, c);
        }
        return makeString(buffer);

    } else if (isInitial(c) || ((c == '+' || c == '-') && isDelimiter(in.peek()))) // FIXME: peek returns int
    {
        string symbol;
        while (isInitial(c) || isdigit(c) || c == '+' || c == '-')
        {
            symbol.append(1, c);
            in >> c;
        }
        if (isDelimiter(c))
        {
            in.putback(c);
            return makeSymbol(symbol);
        } else
        {
            cerr << "symbol not followed by delimiter. " <<
            "Found '" << c << "'" << endl;
        }
    } else if (c == '(')
    {
        return readPair(in);
    } else if (c == '\'')
    {
        const Value *result = nullptr;
        GcGuard guard{gc_};
        guard.pushLocalStackRoot(&result);
        result = read(in);
        if (!result) return nullptr;
        result = makeCell(result, NIL);
        result = makeCell(QUOTE, result);
        return result;
    } else
    {
        std::string msg;
        msg.append("bad input. unexpected '");
        msg.append(1, c);
        msg.append("'");
        throw KatException(msg);
    }
    throw KatException("illegal read state");
}